

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O2

Ssw_Cla_t * Ssw_ClassesStart(Aig_Man_t *pAig)

{
  Ssw_Cla_t *pSVar1;
  Aig_Obj_t ***pppAVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  size_t __nmemb;
  
  pSVar1 = (Ssw_Cla_t *)calloc(1,0x70);
  pSVar1->pAig = pAig;
  __nmemb = (size_t)pAig->vObjs->nSize;
  pppAVar2 = (Aig_Obj_t ***)calloc(__nmemb,8);
  pSVar1->pId2Class = pppAVar2;
  piVar3 = (int *)calloc(__nmemb,4);
  pSVar1->pClassSizes = piVar3;
  pVVar4 = Vec_PtrAlloc(100);
  pSVar1->vClassOld = pVVar4;
  pVVar4 = Vec_PtrAlloc(100);
  pSVar1->vClassNew = pVVar4;
  pVVar4 = Vec_PtrAlloc(1000);
  pSVar1->vRefined = pVVar4;
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  }
  return pSVar1;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesStart( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    p = ABC_ALLOC( Ssw_Cla_t, 1 );
    memset( p, 0, sizeof(Ssw_Cla_t) );
    p->pAig         = pAig;
    p->pId2Class    = ABC_CALLOC( Aig_Obj_t **, Aig_ManObjNumMax(pAig) );
    p->pClassSizes  = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    p->vRefined     = Vec_PtrAlloc( 1000 );
    if ( pAig->pReprs == NULL )
        Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    return p;
}